

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flexbuffers.h
# Opt level: O0

void __thiscall
flexbuffers::Reference::ToString
          (Reference *this,bool strings_quoted,bool keys_quoted,string *s,bool indented,
          int cur_indent,char *indent_string,bool natural_utf8)

{
  size_t *__return_storage_ptr__;
  ulong uVar1;
  bool bVar2;
  uint8_t *puVar3;
  char *pcVar4;
  size_t sVar5;
  size_t length;
  int64_t t;
  uint64_t t_00;
  char *pcVar6;
  double t_01;
  char *local_220;
  undefined1 local_1c0 [8];
  Blob blob;
  TypedVector local_190;
  Vector local_170;
  Reference local_158;
  Reference local_148;
  Reference local_138;
  char *local_128;
  char *p;
  ulong uStack_118;
  bool kq;
  size_t i;
  Vector vals;
  TypedVector keys;
  Map m;
  string local_a0;
  string local_70;
  char *local_50;
  char *str_1;
  String str;
  bool natural_utf8_local;
  int cur_indent_local;
  bool indented_local;
  string *s_local;
  bool keys_quoted_local;
  bool strings_quoted_local;
  Reference *this_local;
  
  str.super_Sized.size_._7_1_ = natural_utf8;
  if (this->type_ == FBT_STRING) {
    puVar3 = Indirect(this);
    String::String((String *)&str_1,puVar3,this->byte_width_);
    if (strings_quoted) {
      pcVar4 = String::c_str((String *)&str_1);
      sVar5 = String::length((String *)&str_1);
      flatbuffers::EscapeString(pcVar4,sVar5,s,true,(bool)(str.super_Sized.size_._7_1_ & 1));
    }
    else {
      pcVar4 = String::c_str((String *)&str_1);
      String::length((String *)&str_1);
      std::__cxx11::string::append((char *)s,(ulong)pcVar4);
    }
  }
  else {
    bVar2 = IsKey(this);
    if (bVar2) {
      pcVar4 = AsKey(this);
      local_50 = pcVar4;
      if (keys_quoted) {
        length = strlen(pcVar4);
        flatbuffers::EscapeString(pcVar4,length,s,true,(bool)(str.super_Sized.size_._7_1_ & 1));
      }
      else {
        std::__cxx11::string::operator+=((string *)s,pcVar4);
      }
    }
    else {
      bVar2 = IsInt(this);
      if (bVar2) {
        t = AsInt64(this);
        flatbuffers::NumToString<long>(&local_70,t);
        std::__cxx11::string::operator+=((string *)s,(string *)&local_70);
        std::__cxx11::string::~string((string *)&local_70);
      }
      else {
        bVar2 = IsUInt(this);
        if (bVar2) {
          t_00 = AsUInt64(this);
          flatbuffers::NumToString<unsigned_long>(&local_a0,t_00);
          std::__cxx11::string::operator+=((string *)s,(string *)&local_a0);
          std::__cxx11::string::~string((string *)&local_a0);
        }
        else {
          bVar2 = IsFloat(this);
          if (bVar2) {
            t_01 = AsDouble(this);
            __return_storage_ptr__ = &m.super_Vector.super_Sized.size_;
            flatbuffers::NumToString<double>((string *)__return_storage_ptr__,t_01);
            std::__cxx11::string::operator+=((string *)s,(string *)__return_storage_ptr__);
            std::__cxx11::string::~string((string *)&m.super_Vector.super_Sized.size_);
          }
          else {
            bVar2 = IsNull(this);
            if (bVar2) {
              std::__cxx11::string::operator+=((string *)s,"null");
            }
            else {
              bVar2 = IsBool(this);
              if (bVar2) {
                bVar2 = AsBool(this);
                pcVar4 = "false";
                if (bVar2) {
                  pcVar4 = "true";
                }
                std::__cxx11::string::operator+=((string *)s,pcVar4);
              }
              else {
                bVar2 = IsMap(this);
                if (bVar2) {
                  std::__cxx11::string::operator+=((string *)s,"{");
                  if (indented) {
                    local_220 = "\n";
                  }
                  else {
                    local_220 = " ";
                  }
                  std::__cxx11::string::operator+=((string *)s,local_220);
                  AsMap((Map *)&keys.type_,this);
                  Map::Keys((TypedVector *)&vals.super_Sized.size_,(Map *)&keys.type_);
                  Map::Values((Vector *)&i,(Map *)&keys.type_);
                  for (uStack_118 = 0; uVar1 = uStack_118,
                      sVar5 = Sized::size((Sized *)&vals.super_Sized.size_), uVar1 < sVar5;
                      uStack_118 = uStack_118 + 1) {
                    p._7_1_ = keys_quoted;
                    if (!keys_quoted) {
                      local_138 = TypedVector::operator[]
                                            ((TypedVector *)&vals.super_Sized.size_,uStack_118);
                      local_128 = AsKey(&local_138);
                      bVar2 = flatbuffers::is_alpha(*local_128);
                      if ((bVar2) || (*local_128 == '_')) {
                        do {
                          pcVar6 = local_128 + 1;
                          pcVar4 = local_128 + 1;
                          local_128 = pcVar6;
                          if (*pcVar4 == '\0') goto LAB_001a86d2;
                          bVar2 = flatbuffers::is_alnum(*pcVar6);
                        } while ((bVar2) || (*local_128 == '_'));
                        p._7_1_ = 1;
                      }
                      else {
                        p._7_1_ = 1;
                      }
                    }
LAB_001a86d2:
                    if (indented) {
                      IndentString(s,cur_indent + 1,indent_string);
                    }
                    local_148 = TypedVector::operator[]
                                          ((TypedVector *)&vals.super_Sized.size_,uStack_118);
                    ToString(&local_148,true,(bool)(p._7_1_ & 1),s);
                    std::__cxx11::string::operator+=((string *)s,": ");
                    local_158 = Vector::operator[]((Vector *)&i,uStack_118);
                    ToString(&local_158,true,keys_quoted,s,indented,cur_indent + 1,indent_string,
                             (bool)(str.super_Sized.size_._7_1_ & 1));
                    uVar1 = uStack_118;
                    sVar5 = Sized::size((Sized *)&vals.super_Sized.size_);
                    if ((uVar1 < sVar5 - 1) &&
                       (std::__cxx11::string::operator+=((string *)s,","), !indented)) {
                      std::__cxx11::string::operator+=((string *)s," ");
                    }
                    if (indented) {
                      std::__cxx11::string::operator+=((string *)s,"\n");
                    }
                  }
                  if (indented) {
                    IndentString(s,cur_indent,indent_string);
                  }
                  else {
                    std::__cxx11::string::operator+=((string *)s," ");
                  }
                  std::__cxx11::string::operator+=((string *)s,"}");
                }
                else {
                  bVar2 = IsVector(this);
                  if (bVar2) {
                    AsVector(&local_170,this);
                    AppendToString<flexbuffers::Vector>
                              (s,&local_170,keys_quoted,indented,cur_indent + 1,indent_string,
                               (bool)(str.super_Sized.size_._7_1_ & 1));
                  }
                  else {
                    bVar2 = IsTypedVector(this);
                    if (bVar2) {
                      AsTypedVector(&local_190,this);
                      AppendToString<flexbuffers::TypedVector>
                                (s,&local_190,keys_quoted,indented,cur_indent + 1,indent_string,
                                 (bool)(str.super_Sized.size_._7_1_ & 1));
                    }
                    else {
                      bVar2 = IsFixedTypedVector(this);
                      if (bVar2) {
                        AsFixedTypedVector((FixedTypedVector *)&blob.super_Sized.size_,this);
                        AppendToString<flexbuffers::FixedTypedVector>
                                  (s,(FixedTypedVector *)&blob.super_Sized.size_,keys_quoted,
                                   indented,cur_indent + 1,indent_string,
                                   (bool)(str.super_Sized.size_._7_1_ & 1));
                      }
                      else {
                        bVar2 = IsBlob(this);
                        if (bVar2) {
                          AsBlob((Blob *)local_1c0,this);
                          puVar3 = Blob::data((Blob *)local_1c0);
                          sVar5 = Sized::size((Sized *)local_1c0);
                          flatbuffers::EscapeString((char *)puVar3,sVar5,s,true,false);
                        }
                        else {
                          std::__cxx11::string::operator+=((string *)s,"(?)");
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

void ToString(bool strings_quoted, bool keys_quoted, std::string &s,
                bool indented, int cur_indent, const char *indent_string,
                bool natural_utf8 = false) const {
    if (type_ == FBT_STRING) {
      String str(Indirect(), byte_width_);
      if (strings_quoted) {
        flatbuffers::EscapeString(str.c_str(), str.length(), &s, true, natural_utf8);
      } else {
        s.append(str.c_str(), str.length());
      }
    } else if (IsKey()) {
      auto str = AsKey();
      if (keys_quoted) {
        flatbuffers::EscapeString(str, strlen(str), &s, true, natural_utf8);
      } else {
        s += str;
      }
    } else if (IsInt()) {
      s += flatbuffers::NumToString(AsInt64());
    } else if (IsUInt()) {
      s += flatbuffers::NumToString(AsUInt64());
    } else if (IsFloat()) {
      s += flatbuffers::NumToString(AsDouble());
    } else if (IsNull()) {
      s += "null";
    } else if (IsBool()) {
      s += AsBool() ? "true" : "false";
    } else if (IsMap()) {
      s += "{";
      s += indented ? "\n" : " ";
      auto m = AsMap();
      auto keys = m.Keys();
      auto vals = m.Values();
      for (size_t i = 0; i < keys.size(); i++) {
        bool kq = keys_quoted;
        if (!kq) {
          // FlexBuffers keys may contain arbitrary characters, only allow
          // unquoted if it looks like an "identifier":
          const char *p = keys[i].AsKey();
          if (!flatbuffers::is_alpha(*p) && *p != '_') {
            kq = true;
          } else {
            while (*++p) {
              if (!flatbuffers::is_alnum(*p) && *p != '_') {
                kq = true;
                break;
              }
            }
          }
        }
        if (indented) IndentString(s, cur_indent + 1, indent_string);
        keys[i].ToString(true, kq, s);
        s += ": ";
        vals[i].ToString(true, keys_quoted, s, indented, cur_indent + 1, indent_string,
                         natural_utf8);
        if (i < keys.size() - 1) {
          s += ",";
          if (!indented) s += " ";
        }
        if (indented) s += "\n";
      }
      if (!indented) s += " ";
      if (indented) IndentString(s, cur_indent, indent_string);
      s += "}";
    } else if (IsVector()) {
      AppendToString<Vector>(s, AsVector(), keys_quoted, indented,
                             cur_indent + 1, indent_string, natural_utf8);
    } else if (IsTypedVector()) {
      AppendToString<TypedVector>(s, AsTypedVector(), keys_quoted, indented,
                                  cur_indent + 1, indent_string,
                                  natural_utf8);
    } else if (IsFixedTypedVector()) {
      AppendToString<FixedTypedVector>(s, AsFixedTypedVector(), keys_quoted,
                                       indented, cur_indent + 1, indent_string,
                                       natural_utf8);
    } else if (IsBlob()) {
      auto blob = AsBlob();
      flatbuffers::EscapeString(reinterpret_cast<const char *>(blob.data()),
                                blob.size(), &s, true, false);
    } else {
      s += "(?)";
    }
  }